

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFPageDocumentHelper::flattenAnnotationsForPage
          (QPDFPageDocumentHelper *this,QPDFPageObjectHelper *page,QPDFObjectHandle *resources,
          QPDFAcroFormDocumentHelper *afdh,int required_flags,int forbidden_flags)

{
  BaseHandle *pBVar1;
  QPDF *this_00;
  string *psVar2;
  pointer pQVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  longlong lVar7;
  QPDFObjGen og;
  pointer this_01;
  allocator<char> local_201;
  undefined1 local_200 [16];
  QPDFObjectHandle as;
  int local_1e0;
  int next_fx;
  string name;
  string content;
  undefined1 local_170 [24];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  QPDFObjectHandle as_resources;
  QPDFObjectHandle rotate_obj;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> annots;
  QPDFObjectHandle local_d8;
  QPDFObjectHandle local_c8;
  QPDFObjectHandle local_b8;
  undefined1 local_a8 [32];
  string new_content;
  QPDFAnnotationObjectHelper local_68;
  
  local_170._16_4_ = required_flags;
  local_170._20_4_ = forbidden_flags;
  bVar4 = QPDFAcroFormDocumentHelper::getNeedAppearances(afdh);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"",(allocator<char> *)&new_content);
  QPDFPageObjectHelper::getAnnotations(&annots,page,&name);
  std::__cxx11::string::~string((string *)&name);
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_content._M_dataplus._M_p = (pointer)&new_content.field_2;
  new_content._M_string_length = 0;
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_content.field_2._M_local_buf[0] = '\0';
  pBVar1 = &(page->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&content,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"/Rotate",(allocator<char> *)&as_resources);
  QPDFObjectHandle::getKey(&rotate_obj,&content);
  std::__cxx11::string::~string((string *)&name);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&content._M_string_length);
  bVar5 = QPDFObjectHandle::isInteger(&rotate_obj);
  local_1e0 = 0;
  if (bVar5) {
    lVar7 = QPDFObjectHandle::getIntValue(&rotate_obj);
    if (lVar7 != 0) {
      local_1e0 = QPDFObjectHandle::getIntValueAsInt(&rotate_obj);
    }
  }
  pQVar3 = annots.
           super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  next_fx = 1;
  this_01 = annots.
            super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_01 == pQVar3) {
      if ((long)new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4 !=
          ((long)annots.
                 super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)annots.
                super__Vector_base<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&content,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
        if (new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            new_annots.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,"/Annots",(allocator<char> *)&as_resources);
          QPDFObjectHandle::removeKey((QPDFObjectHandle *)&content,&name);
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,"/Annots",(allocator<char> *)&as);
          QPDFObjectHandle::getKey(&as_resources,&content);
          std::__cxx11::string::~string((string *)&name);
          QPDFObjectHandle::newArray(&as,&new_annots);
          bVar4 = QPDFObjectHandle::isIndirect(&as_resources);
          if (bVar4) {
            this_00 = (this->super_QPDFDocumentHelper).qpdf;
            og = QPDFObjectHandle::getObjGen(&as_resources);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x10),
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&as);
            QPDF::replaceObject(this_00,og,(QPDFObjectHandle *)(local_a8 + 0x10));
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x18));
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&name,"/Annots",(allocator<char> *)local_200);
            QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&content,&name,&as);
            std::__cxx11::string::~string((string *)&name);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&as.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&as_resources.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        psVar2 = (string *)(this->super_QPDFDocumentHelper).qpdf;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&name,"q\n",(allocator<char> *)&as_resources);
        QPDF::newStream((QPDF *)&local_c8,psVar2);
        QPDFPageObjectHelper::addPageContents(page,&local_c8,true);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&name);
        psVar2 = (string *)(this->super_QPDFDocumentHelper).qpdf;
        std::operator+(&name,"\nQ\n",&new_content);
        QPDF::newStream((QPDF *)&local_d8,psVar2);
        QPDFPageObjectHelper::addPageContents(page,&local_d8,false);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_d8.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&name);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&content._M_string_length);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rotate_obj.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&new_content);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_annots);
      std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::~vector
                (&annots);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"/N",(allocator<char> *)&as_resources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&content,"",(allocator<char> *)local_200);
    QPDFAnnotationObjectHelper::getAppearanceStream
              ((QPDFAnnotationObjectHelper *)&as,(string *)this_01,&name);
    std::__cxx11::string::~string((string *)&content);
    std::__cxx11::string::~string((string *)&name);
    QPDFAnnotationObjectHelper::getSubtype_abi_cxx11_(&name,this_01);
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &name,"/Widget");
    std::__cxx11::string::~string((string *)&name);
    if (bVar4 && bVar5) {
LAB_001a3bf7:
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&name,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this_01->super_QPDFObjectHelper).super_BaseHandle);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
      emplace_back<QPDFObjectHandle>(&new_annots,(QPDFObjectHandle *)&name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
    }
    else {
      bVar6 = QPDFObjectHandle::isStream(&as);
      if (bVar6) {
        if (bVar5) {
          QPDFAnnotationObjectHelper::QPDFAnnotationObjectHelper(&local_68,this_01);
          QPDFAcroFormDocumentHelper::getFieldForAnnotation
                    ((QPDFFormFieldObjectHelper *)&name,afdh,&local_68);
          QPDFAnnotationObjectHelper::~QPDFAnnotationObjectHelper(&local_68);
          QPDFObjectHandle::getDict((QPDFObjectHandle *)local_200);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&content,"/Resources",(allocator<char> *)local_170);
          QPDFObjectHandle::getKey(&as_resources,(string *)local_200);
          std::__cxx11::string::~string((string *)&content);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
          bVar5 = QPDFObjectHandle::isIndirect(&as_resources);
          if (bVar5) {
            QPDFObjectHandle::getDict((QPDFObjectHandle *)local_200);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&content,"/Resources",&local_201);
            QPDFObjectHandle::shallowCopy((QPDFObjectHandle *)local_170);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_200,&content,(QPDFObjectHandle *)local_170);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
            std::__cxx11::string::~string((string *)&content);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
            QPDFObjectHandle::getDict((QPDFObjectHandle *)local_170);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&content,"/Resources",&local_201);
            QPDFObjectHandle::getKey((QPDFObjectHandle *)local_200,(string *)local_170);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&as_resources,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_200);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
            std::__cxx11::string::~string((string *)&content);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
          }
          QPDFFormFieldObjectHelper::getDefaultResources((QPDFFormFieldObjectHelper *)local_a8);
          QPDFObjectHandle::mergeResources
                    (&as_resources,(QPDFObjectHandle *)local_a8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&as_resources.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper((QPDFFormFieldObjectHelper *)&name);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&content,"/Fxo",(allocator<char> *)&as_resources);
        QPDFObjectHandle::getUniqueResourceName
                  (&name,resources,&content,&next_fx,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        std::__cxx11::string::~string((string *)&content);
        QPDFAnnotationObjectHelper::getPageContentForAppearance
                  (&content,this_01,&name,local_1e0,local_170._16_4_,local_170._20_4_);
        if (content._M_string_length != 0) {
          operator____qpdf((char *)&local_b8,0x21616b);
          QPDFObjectHandle::mergeResources
                    (resources,&local_b8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                      *)0x0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_b8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&as_resources,"/XObject",(allocator<char> *)local_170);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_200,(string *)resources);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_200,&name,&as);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8));
          std::__cxx11::string::~string((string *)&as_resources);
          next_fx = next_fx + 1;
        }
        std::__cxx11::string::append((string *)&new_content);
        std::__cxx11::string::~string((string *)&content);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)&name);
        bVar5 = QPDFObjectHandle::isNull((QPDFObjectHandle *)&name);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&name._M_string_length);
        if (bVar5) goto LAB_001a3bf7;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&as.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void
QPDFPageDocumentHelper::flattenAnnotationsForPage(
    QPDFPageObjectHelper& page,
    QPDFObjectHandle& resources,
    QPDFAcroFormDocumentHelper& afdh,
    int required_flags,
    int forbidden_flags)
{
    bool need_appearances = afdh.getNeedAppearances();
    std::vector<QPDFAnnotationObjectHelper> annots = page.getAnnotations();
    std::vector<QPDFObjectHandle> new_annots;
    std::string new_content;
    int rotate = 0;
    QPDFObjectHandle rotate_obj = page.getObjectHandle().getKey("/Rotate");
    if (rotate_obj.isInteger() && rotate_obj.getIntValue()) {
        rotate = rotate_obj.getIntValueAsInt();
    }
    int next_fx = 1;
    for (auto& aoh: annots) {
        QPDFObjectHandle as = aoh.getAppearanceStream("/N");
        bool is_widget = (aoh.getSubtype() == "/Widget");
        bool process = true;
        if (need_appearances && is_widget) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper skip widget need appearances");
            process = false;
        }
        if (process && as.isStream()) {
            if (is_widget) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper merge DR");
                QPDFFormFieldObjectHelper ff = afdh.getFieldForAnnotation(aoh);
                QPDFObjectHandle as_resources = as.getDict().getKey("/Resources");
                if (as_resources.isIndirect()) {
                    QTC::TC("qpdf", "QPDFPageDocumentHelper indirect as resources");
                    as.getDict().replaceKey("/Resources", as_resources.shallowCopy());
                    as_resources = as.getDict().getKey("/Resources");
                }
                as_resources.mergeResources(ff.getDefaultResources());
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper non-widget annotation");
            }
            std::string name = resources.getUniqueResourceName("/Fxo", next_fx);
            std::string content =
                aoh.getPageContentForAppearance(name, rotate, required_flags, forbidden_flags);
            if (!content.empty()) {
                resources.mergeResources("<< /XObject << >> >>"_qpdf);
                resources.getKey("/XObject").replaceKey(name, as);
                ++next_fx;
            }
            new_content += content;
        } else if (process && !aoh.getAppearanceDictionary().isNull()) {
            // If an annotation has no selected appearance stream, just drop the annotation when
            // flattening. This can happen for unchecked checkboxes and radio buttons, popup windows
            // associated with comments that aren't visible, and other types of annotations that
            // aren't visible. Annotations that have no appearance streams at all, such as Link,
            // Popup, and Projection, should be preserved.
            QTC::TC("qpdf", "QPDFPageDocumentHelper ignore annotation with no appearance");
        } else {
            new_annots.push_back(aoh.getObjectHandle());
        }
    }
    if (new_annots.size() != annots.size()) {
        QPDFObjectHandle page_oh = page.getObjectHandle();
        if (new_annots.empty()) {
            QTC::TC("qpdf", "QPDFPageDocumentHelper remove annots");
            page_oh.removeKey("/Annots");
        } else {
            QPDFObjectHandle old_annots = page_oh.getKey("/Annots");
            QPDFObjectHandle new_annots_oh = QPDFObjectHandle::newArray(new_annots);
            if (old_annots.isIndirect()) {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace indirect annots");
                this->qpdf.replaceObject(old_annots.getObjGen(), new_annots_oh);
            } else {
                QTC::TC("qpdf", "QPDFPageDocumentHelper replace direct annots");
                page_oh.replaceKey("/Annots", new_annots_oh);
            }
        }
        page.addPageContents(qpdf.newStream("q\n"), true);
        page.addPageContents(qpdf.newStream("\nQ\n" + new_content), false);
    }
}